

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_get_file_descriptor_flags_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  sexp_conflict local_8;
  
  if ((((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
      ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) ||
     (((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)))) {
    if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
       ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) {
      if (*(long *)(in_RCX + 8) == 0) {
        if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) {
          local_60 = (int)*(undefined8 *)(*(long *)(in_RCX + 6) + 0x10);
        }
        else {
          local_60 = -1;
        }
        local_58 = local_60;
      }
      else {
        local_58 = fileno(*(FILE **)(in_RCX + 8));
      }
      local_68 = local_58;
    }
    else {
      if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
        local_70 = (int)*(undefined8 *)(in_RCX + 4);
      }
      else {
        auVar1._8_8_ = (long)in_RCX >> 0x3f;
        auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
        local_70 = SUB164(auVar1 / SEXT816(2),0);
      }
      local_68 = local_70;
    }
    iVar2 = fcntl(local_68,1);
    local_8 = (sexp_conflict)sexp_make_integer(in_RDI,(long)iVar2,(long)iVar2 >> 0x3f);
  }
  else {
    local_8 = (sexp_conflict)
              sexp_xtype_exception(in_RDI,in_RSI,"not a port or file descriptor",in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_file_descriptor_flags_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  res = sexp_make_integer(ctx, fcntl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), F_GETFD));
  return res;
}